

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_readresp(Curl_easy *data,int sockindex,pingpong *pp,int *ftpcode,size_t *size)

{
  int local_3c;
  CURLcode result;
  int code;
  size_t *size_local;
  int *ftpcode_local;
  pingpong *pp_local;
  Curl_easy *pCStack_18;
  int sockindex_local;
  Curl_easy *data_local;
  
  _result = size;
  size_local = (size_t *)ftpcode;
  ftpcode_local = (int *)pp;
  pp_local._4_4_ = sockindex;
  pCStack_18 = data;
  data_local._4_4_ = Curl_pp_readresp(data,sockindex,pp,&local_3c,size);
  (pCStack_18->info).httpcode = local_3c;
  if (size_local != (size_t *)0x0) {
    *(int *)size_local = local_3c;
  }
  if (local_3c == 0x1a5) {
    if (((pCStack_18 != (Curl_easy *)0x0) &&
        ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
        (0 < ((pCStack_18->state).feat)->log_level)))) {
      Curl_infof(pCStack_18,"We got a 421 - timeout");
    }
    _ftp_state(pCStack_18,'\0');
    data_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_readresp(struct Curl_easy *data,
                             int sockindex,
                             struct pingpong *pp,
                             int *ftpcode, /* return the ftp-code if done */
                             size_t *size) /* size of the response */
{
  int code;
  CURLcode result = Curl_pp_readresp(data, sockindex, pp, &code, size);

#ifdef HAVE_GSSAPI
  {
    struct connectdata *conn = data->conn;
    char * const buf = Curl_dyn_ptr(&data->conn->proto.ftpc.pp.recvbuf);

    /* handle the security-oriented responses 6xx ***/
    switch(code) {
    case 631:
      code = Curl_sec_read_msg(data, conn, buf, PROT_SAFE);
      break;
    case 632:
      code = Curl_sec_read_msg(data, conn, buf, PROT_PRIVATE);
      break;
    case 633:
      code = Curl_sec_read_msg(data, conn, buf, PROT_CONFIDENTIAL);
      break;
    default:
      /* normal ftp stuff we pass through! */
      break;
    }
  }
#endif

  /* store the latest code for later retrieval */
  data->info.httpcode = code;

  if(ftpcode)
    *ftpcode = code;

  if(421 == code) {
    /* 421 means "Service not available, closing control connection." and FTP
     * servers use it to signal that idle session timeout has been exceeded.
     * If we ignored the response, it could end up hanging in some cases.
     *
     * This response code can come at any point so having it treated
     * generically is a good idea.
     */
    infof(data, "We got a 421 - timeout");
    ftp_state(data, FTP_STOP);
    return CURLE_OPERATION_TIMEDOUT;
  }

  return result;
}